

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall perfetto::protos::gen::FtraceConfig::~FtraceConfig(FtraceConfig *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Head_base<0UL,_perfetto::protos::gen::FtraceConfig_CompactSchedConfig_*,_false> _Var3;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__FtraceConfig_003c73f8;
  pcVar2 = (this->unknown_fields_)._M_dataplus._M_p;
  paVar1 = &(this->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  _Var3._M_head_impl =
       (this->compact_sched_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::FtraceConfig_CompactSchedConfig,_std::default_delete<perfetto::protos::gen::FtraceConfig_CompactSchedConfig>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::FtraceConfig_CompactSchedConfig_*,_std::default_delete<perfetto::protos::gen::FtraceConfig_CompactSchedConfig>_>
       .super__Head_base<0UL,_perfetto::protos::gen::FtraceConfig_CompactSchedConfig_*,_false>.
       _M_head_impl;
  if (_Var3._M_head_impl != (FtraceConfig_CompactSchedConfig *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_CppMessageObj + 8))();
  }
  (this->compact_sched_).ptr_._M_t.
  super___uniq_ptr_impl<perfetto::protos::gen::FtraceConfig_CompactSchedConfig,_std::default_delete<perfetto::protos::gen::FtraceConfig_CompactSchedConfig>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::protos::gen::FtraceConfig_CompactSchedConfig_*,_std::default_delete<perfetto::protos::gen::FtraceConfig_CompactSchedConfig>_>
  .super__Head_base<0UL,_perfetto::protos::gen::FtraceConfig_CompactSchedConfig_*,_false>.
  _M_head_impl = (FtraceConfig_CompactSchedConfig *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->atrace_apps_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->atrace_categories_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->ftrace_events_);
  return;
}

Assistant:

FtraceConfig::~FtraceConfig() = default;